

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.h
# Opt level: O2

Rnm_Obj_t * Rnm_ManObj(Rnm_Man_t *p,Gia_Obj_t *pObj,int f)

{
  uint uVar1;
  char *__assertion;
  
  uVar1 = pObj->Value;
  if (uVar1 == 0 && (~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
    __assertion = "Gia_ObjIsConst0(pObj) || pObj->Value";
    uVar1 = 0x5f;
  }
  else if ((int)uVar1 < p->nObjsFrame) {
    if ((-1 < f) && (f <= p->pCex->iFrame)) {
      return p->pObjs + (long)(p->nObjsFrame * f) + (ulong)uVar1;
    }
    __assertion = "f >= 0 && f <= p->pCex->iFrame";
    uVar1 = 0x61;
  }
  else {
    __assertion = "(int)pObj->Value < p->nObjsFrame";
    uVar1 = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                ,uVar1,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

static inline Rnm_Obj_t * Rnm_ManObj( Rnm_Man_t * p, Gia_Obj_t * pObj, int f )  
{ 
    assert( Gia_ObjIsConst0(pObj) || pObj->Value );
    assert( (int)pObj->Value < p->nObjsFrame );
    assert( f >= 0 && f <= p->pCex->iFrame ); 
    return p->pObjs + f * p->nObjsFrame + pObj->Value;  
}